

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerAddressModesTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerAddressModesTest *this)

{
  float fVar1;
  ulong uVar2;
  float *pfVar3;
  size_type sVar4;
  reference pvVar5;
  VecAccess<float,_4,_2> VVar6;
  VecAccess<float,_4,_3> local_c0;
  Vector<float,_3> local_a8;
  undefined1 local_9c [12];
  Vector<float,_3> local_90;
  Vector<float,_3> local_84;
  ulong local_78;
  size_t vertexNdx_2;
  int local_68 [2];
  Vector<float,_2> local_60;
  undefined1 local_58 [8];
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  ulong local_40;
  size_t vertexNdx_1;
  ulong local_28;
  size_t vertexNdx;
  SamplerAddressModesTest *local_18;
  SamplerAddressModesTest *this_local;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  vertexNdx._7_1_ = 0;
  local_18 = this;
  this_local = (SamplerAddressModesTest *)__return_storage_ptr__;
  SamplerTest::createVertices(__return_storage_ptr__,&this->super_SamplerTest);
  switch((this->super_SamplerTest).m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    for (local_28 = 0; uVar2 = local_28,
        sVar4 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                ::size(__return_storage_ptr__), uVar2 < sVar4; local_28 = local_28 + 1) {
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_28);
      pfVar3 = tcu::Vector<float,_4>::x(&pvVar5->texCoord);
      fVar1 = *pfVar3;
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_28);
      pfVar3 = tcu::Vector<float,_4>::x(&pvVar5->texCoord);
      *pfVar3 = (fVar1 + -0.5) * 4.0;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    for (local_40 = 0; uVar2 = local_40,
        sVar4 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                ::size(__return_storage_ptr__), uVar2 < sVar4; local_40 = local_40 + 1) {
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_40);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_58,(int)pvVar5 + 0x10,0);
      tcu::Vector<float,_2>::Vector(&local_60,0.5);
      tcu::operator-((tcu *)&local_50,(Vector<float,_2> *)local_58,&local_60);
      tcu::operator*((tcu *)&local_48,&local_50,4.0);
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_40);
      VVar6 = tcu::Vector<float,_4>::xy(&pvVar5->texCoord);
      local_68 = VVar6.m_index;
      vertexNdx_2 = (size_t)VVar6.m_vector;
      tcu::VecAccess<float,_4,_2>::operator=((VecAccess<float,_4,_2> *)&vertexNdx_2,&local_48);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    for (local_78 = 0; uVar2 = local_78,
        sVar4 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                ::size(__return_storage_ptr__), uVar2 < sVar4; local_78 = local_78 + 1) {
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_78);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_9c,(int)pvVar5 + 0x10,0,1);
      tcu::Vector<float,_3>::Vector(&local_a8,0.5);
      tcu::operator-((tcu *)&local_90,(Vector<float,_3> *)local_9c,&local_a8);
      tcu::operator*((tcu *)&local_84,&local_90,4.0);
      pvVar5 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::operator[](__return_storage_ptr__,local_78);
      tcu::Vector<float,_4>::xyz(&local_c0,&pvVar5->texCoord);
      tcu::VecAccess<float,_4,_3>::operator=(&local_c0,&local_84);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerAddressModesTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = SamplerTest::createVertices();

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D: case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.x() = (vertices[vertexNdx].texCoord.x() - 0.5f) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xy() = (vertices[vertexNdx].texCoord.swizzle(0, 1) - tcu::Vec2(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
				vertices[vertexNdx].texCoord.xyz() = (vertices[vertexNdx].texCoord.swizzle(0, 1, 2) - tcu::Vec3(0.5f)) * 4.0f;

			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			break;

		default:
			DE_ASSERT(false);
	}

	return vertices;
}